

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

uint * Abc_NodeSuperChoiceTruth(Abc_ManScl_t *pManScl)

{
  char cVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  uint *puVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  
  for (lVar8 = 0; lVar8 < pManScl->vLeaves->nSize; lVar8 = lVar8 + 1) {
    pvVar4 = Vec_PtrEntry(pManScl->vLeaves,(int)lVar8);
    *(uint **)((long)pvVar4 + 8) = pManScl->uVars[lVar8];
  }
  puVar5 = (uint *)0x0;
  for (lVar8 = 0; lVar8 < pManScl->vVolume->nSize; lVar8 = lVar8 + 1) {
    plVar6 = (long *)Vec_PtrEntry(pManScl->vVolume,(int)lVar8);
    puVar5 = pManScl->uSims[lVar8];
    plVar6[1] = (long)puVar5;
    lVar2 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
    lVar3 = *(long *)(*(long *)(lVar2 + (long)*(int *)plVar6[4] * 8) + 8);
    lVar2 = *(long *)(*(long *)(lVar2 + (long)((int *)plVar6[4])[1] * 8) + 8);
    cVar1 = ((char *)plVar6[7])[1];
    if (*(char *)plVar6[7] == '0') {
      if (cVar1 == '0') {
        for (lVar7 = 0; lVar7 < pManScl->nWords; lVar7 = lVar7 + 1) {
          puVar5[lVar7] = ~(*(uint *)(lVar2 + lVar7 * 4) | *(uint *)(lVar3 + lVar7 * 4));
        }
      }
      else {
        for (lVar7 = 0; lVar7 < pManScl->nWords; lVar7 = lVar7 + 1) {
          puVar5[lVar7] = ~*(uint *)(lVar3 + lVar7 * 4) & *(uint *)(lVar2 + lVar7 * 4);
        }
      }
    }
    else if (cVar1 == '0') {
      for (lVar7 = 0; lVar7 < pManScl->nWords; lVar7 = lVar7 + 1) {
        puVar5[lVar7] = ~*(uint *)(lVar2 + lVar7 * 4) & *(uint *)(lVar3 + lVar7 * 4);
      }
    }
    else {
      for (lVar7 = 0; lVar7 < pManScl->nWords; lVar7 = lVar7 + 1) {
        puVar5[lVar7] = *(uint *)(lVar2 + lVar7 * 4) & *(uint *)(lVar3 + lVar7 * 4);
      }
    }
  }
  return puVar5;
}

Assistant:

unsigned * Abc_NodeSuperChoiceTruth( Abc_ManScl_t * pManScl )
{
    Abc_Obj_t * pObj;
    unsigned * puData0, * puData1, * puData = NULL;
    char * pSop;
    int i, k;
    // set elementary truth tables
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vLeaves, pObj, i )
        pObj->pNext = (Abc_Obj_t *)pManScl->uVars[i];
    // compute truth tables for internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, pManScl->vVolume, pObj, i )
    {
        // set storage for the node's simulation info
        pObj->pNext = (Abc_Obj_t *)pManScl->uSims[i];
        // get pointer to the simulation info
        puData  = (unsigned *)pObj->pNext;
        puData0 = (unsigned *)Abc_ObjFanin0(pObj)->pNext;
        puData1 = (unsigned *)Abc_ObjFanin1(pObj)->pNext;
        // simulate
        pSop = (char *)pObj->pData;
        if ( pSop[0] == '0' && pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & ~puData1[k];
        else if ( pSop[0] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = ~puData0[k] & puData1[k];
        else if ( pSop[1] == '0' )
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & ~puData1[k];
        else 
            for ( k = 0; k < pManScl->nWords; k++ )
                puData[k] = puData0[k] & puData1[k];
    }
    return puData;
}